

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ClockingDirectionSyntax *pCVar1;
  DeepCloneVisitor visitor_1;
  DeepCloneVisitor visitor;
  ClockingSkewSyntax *local_40;
  Token local_38;
  ClockingSkewSyntax *local_28;
  Token local_20;
  
  local_20 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x28) == (SyntaxNode *)0x0) {
    local_28 = (ClockingSkewSyntax *)0x0;
  }
  else {
    local_28 = (ClockingSkewSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x28),(DeepCloneVisitor *)&local_38,
                          (BumpAllocator *)__child_stack);
  }
  local_38 = parsing::Token::deepClone((Token *)(__fn + 0x30),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x40) == (SyntaxNode *)0x0) {
    local_40 = (ClockingSkewSyntax *)0x0;
  }
  else {
    local_40 = (ClockingSkewSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x40),(DeepCloneVisitor *)&local_40,
                          (BumpAllocator *)__child_stack);
  }
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::ClockingDirectionSyntax,slang::parsing::Token,slang::syntax::ClockingSkewSyntax*,slang::parsing::Token,slang::syntax::ClockingSkewSyntax*>
                     ((BumpAllocator *)__child_stack,&local_20,&local_28,&local_38,&local_40);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const ClockingDirectionSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ClockingDirectionSyntax>(
        node.input.deepClone(alloc),
        node.inputSkew ? deepClone(*node.inputSkew, alloc) : nullptr,
        node.output.deepClone(alloc),
        node.outputSkew ? deepClone(*node.outputSkew, alloc) : nullptr
    );
}